

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretFlow.c
# Opt level: O0

void dfsfast_e_retreat(Abc_Obj_t *pObj)

{
  Flow_Data_t *pFVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  Abc_Obj_t *pAVar6;
  int *piVar7;
  uint local_c4;
  uint local_9c;
  uint local_84;
  uint local_6c;
  uint local_54;
  uint local_34;
  int min_dist;
  int adj_dist;
  int old_dist;
  int *h;
  int i;
  Abc_Obj_t *pNext;
  Abc_Obj_t *pObj_local;
  
  pFVar1 = pManMR->pDataArray;
  uVar3 = Abc_ObjId(pObj);
  uVar3 = *(uint *)&pFVar1[uVar3].field_0x10 & 0xffff;
  local_34 = 30000;
  if (pManMR->fIsForward == 0) {
    for (h._4_4_ = 0; iVar4 = Abc_ObjFaninNum(pObj), h._4_4_ < iVar4; h._4_4_ = h._4_4_ + 1) {
      pAVar6 = Abc_ObjFanin(pObj,h._4_4_);
      pFVar1 = pManMR->pDataArray;
      uVar5 = Abc_ObjId(pAVar6);
      local_6c = *(uint *)&pFVar1[uVar5].field_0x10 >> 0x10;
      if (local_6c != 0) {
        if (local_34 < local_6c) {
          local_6c = local_34;
        }
        local_34 = local_6c;
      }
    }
  }
  else {
    for (h._4_4_ = 0; iVar4 = Abc_ObjFanoutNum(pObj), h._4_4_ < iVar4; h._4_4_ = h._4_4_ + 1) {
      pAVar6 = Abc_ObjFanout(pObj,h._4_4_);
      pFVar1 = pManMR->pDataArray;
      uVar5 = Abc_ObjId(pAVar6);
      local_54 = *(uint *)&pFVar1[uVar5].field_0x10 >> 0x10;
      if (local_54 != 0) {
        if (local_34 < local_54) {
          local_54 = local_34;
        }
        local_34 = local_54;
      }
    }
  }
  iVar4 = Abc_ObjIsLatch(pObj);
  if (iVar4 == 0) {
    pFVar1 = pManMR->pDataArray;
    uVar5 = Abc_ObjId(pObj);
    if ((undefined1  [24])((undefined1  [24])pFVar1[uVar5] & (undefined1  [24])0x4) !=
        (undefined1  [24])0x0) {
      pFVar1 = pManMR->pDataArray;
      uVar5 = Abc_ObjId(pObj);
      local_84 = *(uint *)&pFVar1[uVar5].field_0x10 >> 0x10;
      if (local_84 != 0) {
        if (local_34 < local_84) {
          local_84 = local_34;
        }
        local_34 = local_84;
      }
    }
    if (pManMR->fIsForward == 0) {
      for (h._4_4_ = 0; iVar4 = Abc_ObjFanoutNum(pObj), h._4_4_ < iVar4; h._4_4_ = h._4_4_ + 1) {
        pAVar6 = Abc_ObjFanout(pObj,h._4_4_);
        pFVar1 = pManMR->pDataArray;
        uVar5 = Abc_ObjId(pAVar6);
        local_9c = *(uint *)&pFVar1[uVar5].field_0x10 & 0xffff;
        if (local_9c != 0) {
          if (local_34 < local_9c) {
            local_9c = local_34;
          }
          local_34 = local_9c;
        }
      }
      if (pManMR->maxDelay != 0) {
        h._4_4_ = 0;
        while( true ) {
          pVVar2 = pManMR->vTimeEdges;
          uVar5 = Abc_ObjId(pObj);
          iVar4 = Vec_PtrSize(pVVar2 + uVar5);
          if (iVar4 <= h._4_4_) break;
          pVVar2 = pManMR->vTimeEdges;
          uVar5 = Abc_ObjId(pObj);
          pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(pVVar2 + uVar5,h._4_4_);
          pFVar1 = pManMR->pDataArray;
          uVar5 = Abc_ObjId(pAVar6);
          local_c4 = *(uint *)&pFVar1[uVar5].field_0x10 & 0xffff;
          if (local_c4 != 0) {
            if (local_34 < local_c4) {
              local_c4 = local_34;
            }
            local_34 = local_c4;
          }
          h._4_4_ = h._4_4_ + 1;
        }
      }
    }
  }
  local_34 = local_34 + 1;
  if (29999 < local_34) {
    local_34 = 0;
  }
  pFVar1 = pManMR->pDataArray;
  uVar5 = Abc_ObjId(pObj);
  *(uint *)&pFVar1[uVar5].field_0x10 =
       *(uint *)&pFVar1[uVar5].field_0x10 & 0xffff0000 | local_34 & 0xffff;
  iVar4 = Vec_IntSize(pManMR->vSinkDistHist);
  if ((int)local_34 < iVar4) {
    piVar7 = Vec_IntArray(pManMR->vSinkDistHist);
    piVar7[(int)uVar3] = piVar7[(int)uVar3] + -1;
    piVar7[(int)local_34] = piVar7[(int)local_34] + 1;
    if (piVar7[(int)uVar3] == 0) {
      pManMR->fSinkDistTerminate = 1;
    }
    return;
  }
  __assert_fail("min_dist < Vec_IntSize(pManMR->vSinkDistHist)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretFlow.c"
                ,0x1c9,"void dfsfast_e_retreat(Abc_Obj_t *)");
}

Assistant:

void
dfsfast_e_retreat(Abc_Obj_t *pObj) {
  Abc_Obj_t *pNext;
  int i, *h;
  int old_dist = FDATA(pObj)->e_dist;
  int adj_dist, min_dist = MAX_DIST;
  
  // 1. structural edges
  if (pManMR->fIsForward)
    Abc_ObjForEachFanout( pObj, pNext, i ) {
      adj_dist = FDATA(pNext)->r_dist;
      if (adj_dist) min_dist = MIN(min_dist, adj_dist);
    }
  else
    Abc_ObjForEachFanin( pObj, pNext, i ) {
      adj_dist = FDATA(pNext)->r_dist;
      if (adj_dist) min_dist = MIN(min_dist, adj_dist);
    }

  if (Abc_ObjIsLatch(pObj)) goto update;

  // 2. through
  if (FTEST(pObj, FLOW)) {
    adj_dist = FDATA(pObj)->r_dist;
    if (adj_dist) min_dist = MIN(min_dist, adj_dist);
  }

  // 3. reverse edges (backward retiming only)
  if (!pManMR->fIsForward) {
    Abc_ObjForEachFanout( pObj, pNext, i ) {
      adj_dist = FDATA(pNext)->e_dist;
      if (adj_dist) min_dist = MIN(min_dist, adj_dist);
    }

  // 4. timing edges (backward retiming only)
#if !defined(IGNORE_TIMING)
    if (pManMR->maxDelay) 
      Vec_PtrForEachEntry(Abc_Obj_t*, FTIMEEDGES(pObj), pNext, i) {
        adj_dist = FDATA(pNext)->e_dist;
        if (adj_dist) min_dist = MIN(min_dist, adj_dist);
      }
#endif
  }

 update:
  ++min_dist;
  if (min_dist >= MAX_DIST) min_dist = 0;
  // printf("[%de=%d->%d] ", Abc_ObjId(pObj), old_dist, min_dist+1);
  FDATA(pObj)->e_dist = min_dist;

  assert(min_dist < Vec_IntSize(pManMR->vSinkDistHist));
  h = Vec_IntArray(pManMR->vSinkDistHist);
  h[old_dist]--;
  h[min_dist]++;
  if (!h[old_dist]) {
    pManMR->fSinkDistTerminate = 1;
  }
}